

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O1

Pass * wasm::createPoppifyPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x30);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  pPVar1->_vptr_Pass = (_func_int **)&PTR__Pass_00d89ce0;
  return pPVar1;
}

Assistant:

Pass* createPoppifyPass() { return new PoppifyPass; }